

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

bool __thiscall ExpressionContext::IsGenericFunction(ExpressionContext *this,FunctionData *function)

{
  TypeBase *pTVar1;
  char cVar2;
  MatchData *pMVar3;
  
  cVar2 = '\x01';
  if (((function->type->super_TypeBase).isGeneric == false) &&
     ((pTVar1 = function->scope->ownerType, pTVar1 == (TypeBase *)0x0 ||
      (pTVar1->isGeneric == false)))) {
    pMVar3 = (function->generics).head;
    if (pMVar3 == (MatchData *)0x0) {
      return false;
    }
    do {
      cVar2 = pMVar3->type->isGeneric;
      if ((bool)cVar2 == true) {
        return true;
      }
      pMVar3 = pMVar3->next;
    } while (pMVar3 != (MatchData *)0x0);
  }
  return (bool)cVar2;
}

Assistant:

bool ExpressionContext::IsGenericFunction(FunctionData *function)
{
	if(function->type->isGeneric)
		return true;

	if(function->scope->ownerType && function->scope->ownerType->isGeneric)
		return true;

	for(MatchData *curr = function->generics.head; curr; curr = curr->next)
	{
		if(curr->type->isGeneric)
			return true;
	}

	return false;
}